

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O0

DdNode * Cudd_addResidue(DdManager *dd,int n,int m,int options,int top)

{
  uint uVar1;
  uint uVar2;
  void *__ptr;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *res;
  DdNode *tmp;
  DdNode *var;
  DdNode **array [2];
  int local_50;
  int index;
  int previous;
  int thisOne;
  int residue;
  int t;
  int k;
  int j;
  int i;
  int tc;
  int msbLsb;
  int top_local;
  int options_local;
  int m_local;
  int n_local;
  DdManager *dd_local;
  
  if ((n < 1) && (m < 2)) {
    dd_local = (DdManager *)0x0;
  }
  else {
    __ptr = malloc((long)m << 3);
    if (__ptr == (void *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      dd_local = (DdManager *)0x0;
    }
    else {
      array[0] = (DdNode **)malloc((long)m << 3);
      if (array[0] == (DdNode **)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        dd_local = (DdManager *)0x0;
      }
      else {
        for (k = 0; k < m; k = k + 1) {
          array[0][k] = (DdNode *)0x0;
          *(undefined8 *)((long)__ptr + (long)k * 8) = 0;
        }
        for (k = 0; k < m; k = k + 1) {
          pDVar3 = cuddUniqueConst(dd,(double)k);
          if (pDVar3 == (DdNode *)0x0) {
            for (t = 0; t < k; t = t + 1) {
              Cudd_RecursiveDeref(dd,array[0][t]);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (array[0] != (DdNode **)0x0) {
              free(array[0]);
            }
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          array[0][k] = pDVar3;
        }
        previous = 1;
        for (residue = 0; residue < n; residue = residue + 1) {
          uVar1 = residue & 1;
          uVar2 = uVar1 ^ 1;
          if ((options & 1U) == 0) {
            local_50 = top + residue;
          }
          else {
            local_50 = ((top + n) - residue) + -1;
          }
          pDVar3 = cuddUniqueInter(dd,local_50,dd->one,dd->zero);
          if (pDVar3 == (DdNode *)0x0) {
            for (t = 0; t < m; t = t + 1) {
              Cudd_RecursiveDeref(dd,array[(long)(int)uVar2 + -1][t]);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (array[0] != (DdNode **)0x0) {
              free(array[0]);
            }
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          for (k = 0; k < m; k = k + 1) {
            pDVar4 = Cudd_addIte(dd,pDVar3,array[(long)(int)uVar2 + -1][(k + previous) % m],
                                 array[(long)(int)uVar2 + -1][k]);
            if (pDVar4 == (DdNode *)0x0) {
              for (t = 0; t < k; t = t + 1) {
                Cudd_RecursiveDeref(dd,array[(long)(int)uVar1 + -1][t]);
              }
              for (t = 0; t < m; t = t + 1) {
                Cudd_RecursiveDeref(dd,array[(long)(int)uVar2 + -1][t]);
              }
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              if (array[0] != (DdNode **)0x0) {
                free(array[0]);
              }
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
            array[(long)(int)uVar1 + -1][k] = pDVar4;
          }
          for (k = 0; k < m; k = k + 1) {
            Cudd_RecursiveDeref(dd,array[(long)(int)uVar2 + -1][k]);
          }
          Cudd_RecursiveDeref(dd,pDVar3);
          previous = (previous << 1) % m;
          if (((options & 2U) != 0) && (residue == n + -1)) {
            previous = (m - previous) % m;
          }
        }
        for (k = 1; k < m; k = k + 1) {
          Cudd_RecursiveDeref(dd,array[(long)(int)(n - 1U & 1) + -1][k]);
        }
        dd_local = (DdManager *)*array[(long)(int)(n - 1U & 1) + -1];
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        if (array[0] != (DdNode **)0x0) {
          free(array[0]);
        }
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addResidue(
  DdManager * dd /* manager */,
  int  n /* number of bits */,
  int  m /* modulus */,
  int  options /* options */,
  int  top /* index of top variable */)
{
    int msbLsb; /* MSB on top (1) or LSB on top (0) */
    int tc;     /* two's complement (1) or unsigned (0) */
    int i, j, k, t, residue, thisOne, previous, index;
    DdNode **array[2], *var, *tmp, *res;

    /* Sanity check. */
    if (n < 1 && m < 2) return(NULL);

    msbLsb = options & CUDD_RESIDUE_MSB;
    tc = options & CUDD_RESIDUE_TC;

    /* Allocate and initialize working arrays. */
    array[0] = ABC_ALLOC(DdNode *,m);
    if (array[0] == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    array[1] = ABC_ALLOC(DdNode *,m);
    if (array[1] == NULL) {
        ABC_FREE(array[0]);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < m; i++) {
        array[0][i] = array[1][i] = NULL;
    }

    /* Initialize residues. */
    for (i = 0; i < m; i++) {
        tmp = cuddUniqueConst(dd,(CUDD_VALUE_TYPE) i);
        if (tmp == NULL) {
            for (j = 0; j < i; j++) {
                Cudd_RecursiveDeref(dd,array[1][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(tmp);
        array[1][i] = tmp;
    }

    /* Main iteration. */
    residue = 1;        /* residue of 2**0 */
    for (k = 0; k < n; k++) {
        /* Choose current and previous arrays. */
        thisOne = k & 1;
        previous = thisOne ^ 1;
        /* Build an ADD projection function. */
        if (msbLsb) {
            index = top+n-k-1;
        } else {
            index = top+k;
        }
        var = cuddUniqueInter(dd,index,DD_ONE(dd),DD_ZERO(dd));
        if (var == NULL) {
            for (j = 0; j < m; j++) {
                Cudd_RecursiveDeref(dd,array[previous][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(var);
        for (i = 0; i < m; i ++) {
            t = (i + residue) % m;
            tmp = Cudd_addIte(dd,var,array[previous][t],array[previous][i]);
            if (tmp == NULL) {
                for (j = 0; j < i; j++) {
                    Cudd_RecursiveDeref(dd,array[thisOne][j]);
                }
                for (j = 0; j < m; j++) {
                    Cudd_RecursiveDeref(dd,array[previous][j]);
                }
                ABC_FREE(array[0]);
                ABC_FREE(array[1]);
                return(NULL);
            }
            cuddRef(tmp);
            array[thisOne][i] = tmp;
        }
        /* One layer completed. Free the other array for the next iteration. */
        for (i = 0; i < m; i++) {
            Cudd_RecursiveDeref(dd,array[previous][i]);
        }
        Cudd_RecursiveDeref(dd,var);
        /* Update residue of 2**k. */
        residue = (2 * residue) % m;
        /* Adjust residue for MSB, if this is a two's complement number. */
        if (tc && (k == n - 1)) {
            residue = (m - residue) % m;
        }
    }

    /* We are only interested in the 0-residue node of the top layer. */
    for (i = 1; i < m; i++) {
        Cudd_RecursiveDeref(dd,array[(n - 1) & 1][i]);
    }
    res = array[(n - 1) & 1][0];

    ABC_FREE(array[0]);
    ABC_FREE(array[1]);

    cuddDeref(res);
    return(res);

}